

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O3

vector<duckdb::MetadataBlockInfo,_true> * __thiscall
duckdb::MetadataManager::GetMetadataInfo
          (vector<duckdb::MetadataBlockInfo,_true> *__return_storage_ptr__,MetadataManager *this)

{
  _Hash_node_base *p_Var1;
  pointer pMVar2;
  pointer pMVar3;
  long lVar4;
  unsigned_long *puVar5;
  iterator iVar6;
  ulong uVar7;
  __normal_iterator<duckdb::MetadataBlockInfo_*,_std::vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>_>
  __i;
  pointer pMVar8;
  _Hash_node_base *p_Var9;
  _Hash_node_base *p_Var10;
  MetadataBlockInfo block_info;
  undefined1 local_60 [16];
  unsigned_long *local_50;
  iterator iStack_48;
  unsigned_long *local_40;
  ulong local_38;
  
  (__return_storage_ptr__->
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>).
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>).
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>).
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var10 = (this->blocks)._M_h._M_before_begin._M_nxt;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    do {
      local_50 = (unsigned_long *)0x0;
      iStack_48._M_current = (unsigned_long *)0x0;
      local_40 = (unsigned_long *)0x0;
      local_60._0_8_ = p_Var10[4]._M_nxt;
      local_60._8_8_ = 0x40;
      p_Var9 = p_Var10[5]._M_nxt;
      p_Var1 = p_Var10[6]._M_nxt;
      if (p_Var9 != p_Var1) {
        do {
          local_38 = (ulong)*(byte *)&p_Var9->_M_nxt;
          if (iStack_48._M_current == local_40) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,iStack_48,
                       &local_38);
          }
          else {
            *iStack_48._M_current = local_38;
            iStack_48._M_current = iStack_48._M_current + 1;
          }
          iVar6._M_current = iStack_48._M_current;
          puVar5 = local_50;
          p_Var9 = (_Hash_node_base *)((long)&p_Var9->_M_nxt + 1);
        } while (p_Var9 != p_Var1);
        if (local_50 != iStack_48._M_current) {
          uVar7 = (long)iStack_48._M_current - (long)local_50 >> 3;
          lVar4 = 0x3f;
          if (uVar7 != 0) {
            for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          ::std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_50,iStack_48._M_current,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
          ::std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar5,iVar6._M_current);
        }
      }
      ::std::vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>::
      emplace_back<duckdb::MetadataBlockInfo>
                (&__return_storage_ptr__->
                  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>
                 ,(MetadataBlockInfo *)local_60);
      if (local_50 != (unsigned_long *)0x0) {
        operator_delete(local_50);
      }
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
    pMVar2 = (__return_storage_ptr__->
             super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>).
             super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar3 = (__return_storage_ptr__->
             super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>).
             super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar2 != pMVar3) {
      uVar7 = ((long)pMVar3 - (long)pMVar2 >> 3) * -0x3333333333333333;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::MetadataBlockInfo*,std::vector<duckdb::MetadataBlockInfo,std::allocator<duckdb::MetadataBlockInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::MetadataManager::GetMetadataInfo()const::__0>>
                (pMVar2,pMVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pMVar3 - (long)pMVar2 < 0x281) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::MetadataBlockInfo*,std::vector<duckdb::MetadataBlockInfo,std::allocator<duckdb::MetadataBlockInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::MetadataManager::GetMetadataInfo()const::__0>>
                  (pMVar2,pMVar3);
      }
      else {
        pMVar8 = pMVar2 + 0x10;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::MetadataBlockInfo*,std::vector<duckdb::MetadataBlockInfo,std::allocator<duckdb::MetadataBlockInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::MetadataManager::GetMetadataInfo()const::__0>>
                  (pMVar2,pMVar8);
        for (; pMVar8 != pMVar3; pMVar8 = pMVar8 + 1) {
          ::std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<duckdb::MetadataBlockInfo*,std::vector<duckdb::MetadataBlockInfo,std::allocator<duckdb::MetadataBlockInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::MetadataManager::GetMetadataInfo()const::__0>>
                    (pMVar8);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<MetadataBlockInfo> MetadataManager::GetMetadataInfo() const {
	vector<MetadataBlockInfo> result;
	for (auto &block : blocks) {
		MetadataBlockInfo block_info;
		block_info.block_id = block.second.block_id;
		block_info.total_blocks = MetadataManager::METADATA_BLOCK_COUNT;
		for (auto free_block : block.second.free_blocks) {
			block_info.free_list.push_back(free_block);
		}
		std::sort(block_info.free_list.begin(), block_info.free_list.end());
		result.push_back(std::move(block_info));
	}
	std::sort(result.begin(), result.end(),
	          [](const MetadataBlockInfo &a, const MetadataBlockInfo &b) { return a.block_id < b.block_id; });
	return result;
}